

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o3dgcTriangleFans.cpp
# Opt level: O0

O3DGCErrorCode __thiscall
o3dgc::CompressedTriangleFans::SaveBinAC
          (CompressedTriangleFans *this,Vector<long> *data,BinaryStream *bstream)

{
  uint uVar1;
  unsigned_long position;
  unsigned_long uVar2;
  uchar *puVar3;
  uint *puVar4;
  ulong local_a0;
  unsigned_long i_1;
  unsigned_long encodedBytes;
  unsigned_long i;
  Adaptive_Bit_Model bModel;
  undefined1 local_68 [8];
  Arithmetic_Codec ace;
  unsigned_long size;
  uint NMAX;
  unsigned_long start;
  BinaryStream *bstream_local;
  Vector<long> *data_local;
  CompressedTriangleFans *this_local;
  
  position = BinaryStream::GetSize(bstream);
  uVar2 = Vector<long>::GetSize(data);
  uVar1 = (int)(uVar2 << 3) + 100;
  ace._40_8_ = Vector<long>::GetSize(data);
  BinaryStream::WriteUInt32Bin(bstream,0);
  BinaryStream::WriteUInt32Bin(bstream,ace._40_8_);
  if (ace._40_8_ != 0) {
    if (this->m_sizeBufferAC < (ulong)uVar1) {
      if (this->m_bufferAC != (uchar *)0x0) {
        operator_delete__(this->m_bufferAC);
      }
      this->m_sizeBufferAC = (ulong)uVar1;
      puVar3 = (uchar *)operator_new__(this->m_sizeBufferAC);
      this->m_bufferAC = puVar3;
    }
    Arithmetic_Codec::Arithmetic_Codec((Arithmetic_Codec *)local_68);
    Arithmetic_Codec::set_buffer((Arithmetic_Codec *)local_68,uVar1,this->m_bufferAC);
    Arithmetic_Codec::start_encoder((Arithmetic_Codec *)local_68);
    Adaptive_Bit_Model::Adaptive_Bit_Model((Adaptive_Bit_Model *)&i);
    for (encodedBytes = 0; encodedBytes < (ulong)ace._40_8_; encodedBytes = encodedBytes + 1) {
      puVar4 = (uint *)Vector<long>::operator[](data,encodedBytes);
      Arithmetic_Codec::encode((Arithmetic_Codec *)local_68,*puVar4,(Adaptive_Bit_Model *)&i);
    }
    uVar1 = Arithmetic_Codec::stop_encoder((Arithmetic_Codec *)local_68);
    for (local_a0 = 0; local_a0 < uVar1; local_a0 = local_a0 + 1) {
      BinaryStream::WriteUChar8Bin(bstream,this->m_bufferAC[local_a0]);
    }
    Arithmetic_Codec::~Arithmetic_Codec((Arithmetic_Codec *)local_68);
  }
  uVar2 = BinaryStream::GetSize(bstream);
  BinaryStream::WriteUInt32Bin(bstream,position,uVar2 - position);
  return O3DGC_OK;
}

Assistant:

O3DGCErrorCode    CompressedTriangleFans::SaveBinAC(const Vector<long> & data,
                                                         BinaryStream & bstream) 
    {
        unsigned long start = bstream.GetSize();     
        const unsigned int NMAX = data.GetSize() * 8 + 100;
        const unsigned long size       = data.GetSize();
        bstream.WriteUInt32Bin(0);
        bstream.WriteUInt32Bin(size);
        if (size > 0)
        {
            if ( m_sizeBufferAC < NMAX )
            {
                delete [] m_bufferAC;
                m_sizeBufferAC = NMAX;
                m_bufferAC     = new unsigned char [m_sizeBufferAC];
            }
            Arithmetic_Codec ace;
            ace.set_buffer(NMAX, m_bufferAC);
            ace.start_encoder();
            Adaptive_Bit_Model bModel;
    #ifdef DEBUG_VERBOSE
            printf("-----------\nsize %i, start %i\n", size, start);
            fprintf(g_fileDebugTF, "-----------\nsize %i, start %i\n", size, start);
    #endif //DEBUG_VERBOSE
            for(unsigned long i = 0; i < size; ++i)
            {
                ace.encode(data[i], bModel);
    #ifdef DEBUG_VERBOSE
                printf("%i\t%i\n", i, data[i]);
                fprintf(g_fileDebugTF, "%i\t%i\n", i, data[i]);
    #endif //DEBUG_VERBOSE
            }
            unsigned long encodedBytes = ace.stop_encoder();
            for(unsigned long i = 0; i < encodedBytes; ++i)
            {
                bstream.WriteUChar8Bin(m_bufferAC[i]);
            }
        }
        bstream.WriteUInt32Bin(start, bstream.GetSize() - start);
        return O3DGC_OK;
    }